

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglRobustnessTests.cpp
# Opt level: O0

void __thiscall deqp::egl::anon_unknown_1::FixedFunctionOOB::setup(FixedFunctionOOB *this)

{
  Functions *gl;
  glUseProgramFunc p_Var1;
  glGetAttribLocationFunc p_Var2;
  bool bVar3;
  deUint32 dVar4;
  GLenum GVar5;
  deBool dVar6;
  GLint GVar7;
  TestError *pTVar8;
  undefined8 uStack_1e8;
  GLfloat coords [8];
  ProgramSources local_1b0;
  undefined1 local_e0 [8];
  ShaderProgram program;
  FixedFunctionOOB *this_local;
  
  gl = (this->super_ContextReset).m_gl;
  program.m_program.m_info.linkTimeUs = (deUint64)this;
  genSources(&local_1b0,this);
  glu::ShaderProgram::ShaderProgram((ShaderProgram *)local_e0,gl,&local_1b0);
  glu::ProgramSources::~ProgramSources(&local_1b0);
  glu::operator<<((this->super_ContextReset).m_log,(ShaderProgram *)local_e0);
  bVar3 = glu::ShaderProgram::isOk((ShaderProgram *)local_e0);
  if (!bVar3) {
    pTVar8 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (pTVar8,"Failed to compile shader program",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglRobustnessTests.cpp"
               ,0x3d4);
    __cxa_throw(pTVar8,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
  }
  do {
    p_Var1 = ((this->super_ContextReset).m_gl)->useProgram;
    dVar4 = glu::ShaderProgram::getProgram((ShaderProgram *)local_e0);
    (*p_Var1)(dVar4);
    GVar5 = (*((this->super_ContextReset).m_gl)->getError)();
    glu::checkError(GVar5,"useProgram(program.getProgram())",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglRobustnessTests.cpp"
                    ,0x3d6);
    dVar6 = ::deGetFalse();
  } while (dVar6 != 0);
  coords[2] = 1.0;
  coords[3] = 1.0;
  coords[4] = -1.0;
  coords[5] = 1.0;
  uStack_1e8 = 0xbf800000bf800000;
  coords[0] = 1.0;
  coords[1] = -1.0;
  p_Var2 = ((this->super_ContextReset).m_gl)->getAttribLocation;
  dVar4 = glu::ShaderProgram::getProgram((ShaderProgram *)local_e0);
  GVar7 = (*p_Var2)(dVar4,"a_position");
  this->m_coordLocation = GVar7;
  GVar5 = (*((this->super_ContextReset).m_gl)->getError)();
  glu::checkError(GVar5,"glGetAttribLocation()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglRobustnessTests.cpp"
                  ,0x3e1);
  while ((dVar6 = ::deGetFalse(), dVar6 == 0 && (this->m_coordLocation != -1))) {
    dVar6 = ::deGetFalse();
    if (dVar6 == 0) {
      this->m_coordinatesBuffer = 0;
      do {
        (*((this->super_ContextReset).m_gl)->genBuffers)(1,&this->m_coordinatesBuffer);
        GVar5 = (*((this->super_ContextReset).m_gl)->getError)();
        glu::checkError(GVar5,"genBuffers(1, &m_coordinatesBuffer)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglRobustnessTests.cpp"
                        ,0x3e6);
        dVar6 = ::deGetFalse();
      } while (dVar6 != 0);
      do {
        (*((this->super_ContextReset).m_gl)->bindBuffer)(0x8892,this->m_coordinatesBuffer);
        GVar5 = (*((this->super_ContextReset).m_gl)->getError)();
        glu::checkError(GVar5,"bindBuffer(GL_ARRAY_BUFFER, m_coordinatesBuffer)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglRobustnessTests.cpp"
                        ,999);
        dVar6 = ::deGetFalse();
      } while (dVar6 != 0);
      do {
        (*((this->super_ContextReset).m_gl)->bufferData)(0x8892,0x20,&uStack_1e8,0x88e4);
        GVar5 = (*((this->super_ContextReset).m_gl)->getError)();
        glu::checkError(GVar5,
                        "bufferData(GL_ARRAY_BUFFER, (glw::GLsizeiptr)sizeof(coords), coords, GL_STATIC_DRAW)"
                        ,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglRobustnessTests.cpp"
                        ,1000);
        dVar6 = ::deGetFalse();
      } while (dVar6 != 0);
      do {
        (*((this->super_ContextReset).m_gl)->enableVertexAttribArray)(this->m_coordLocation);
        GVar5 = (*((this->super_ContextReset).m_gl)->getError)();
        glu::checkError(GVar5,"enableVertexAttribArray(m_coordLocation)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglRobustnessTests.cpp"
                        ,0x3e9);
        dVar6 = ::deGetFalse();
      } while (dVar6 != 0);
      do {
        (*((this->super_ContextReset).m_gl)->vertexAttribPointer)
                  (this->m_coordLocation,2,0x1406,'\0',0,(void *)0x0);
        GVar5 = (*((this->super_ContextReset).m_gl)->getError)();
        glu::checkError(GVar5,
                        "vertexAttribPointer(m_coordLocation, 2, GL_FLOAT, GL_FALSE, 0, DE_NULL)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglRobustnessTests.cpp"
                        ,0x3ea);
        dVar6 = ::deGetFalse();
      } while (dVar6 != 0);
      glu::ShaderProgram::~ShaderProgram((ShaderProgram *)local_e0);
      return;
    }
  }
  pTVar8 = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (pTVar8,(char *)0x0,"m_coordLocation != (glw::GLint)-1",
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglRobustnessTests.cpp"
             ,0x3e2);
  __cxa_throw(pTVar8,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
}

Assistant:

void FixedFunctionOOB::setup (void)
{
	glu::ShaderProgram program(m_gl, genSources());

	m_log << program;

	if (!program.isOk())
		TCU_FAIL("Failed to compile shader program");

	GLU_CHECK_GLW_CALL(m_gl, useProgram(program.getProgram()));

	const glw::GLfloat coords[] =
	{
		-1.0f, -1.0f,
		 1.0f, -1.0f,
		 1.0f,	1.0f,
		-1.0f,	1.0f
	};

	m_coordLocation = m_gl.getAttribLocation(program.getProgram(), "a_position");
	GLU_CHECK_GLW_MSG(m_gl, "glGetAttribLocation()");
	TCU_CHECK(m_coordLocation != (glw::GLint)-1);

	// Load the vertex data
	m_coordinatesBuffer = 0;
	GLU_CHECK_GLW_CALL(m_gl, genBuffers(1, &m_coordinatesBuffer));
	GLU_CHECK_GLW_CALL(m_gl, bindBuffer(GL_ARRAY_BUFFER, m_coordinatesBuffer));
	GLU_CHECK_GLW_CALL(m_gl, bufferData(GL_ARRAY_BUFFER, (glw::GLsizeiptr)sizeof(coords), coords, GL_STATIC_DRAW));
	GLU_CHECK_GLW_CALL(m_gl, enableVertexAttribArray(m_coordLocation));
	GLU_CHECK_GLW_CALL(m_gl, vertexAttribPointer(m_coordLocation, 2, GL_FLOAT, GL_FALSE, 0, DE_NULL));
}